

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::SymmetricOuterEdgeCase::iterate
          (SymmetricOuterEdgeCase *this)

{
  char *pcVar1;
  qpTestLog *pqVar2;
  bool bVar3;
  TessPrimitiveType TVar4;
  RenderContext *pRVar5;
  undefined8 uVar6;
  pointer pfVar7;
  pointer pfVar8;
  pointer pVVar9;
  undefined4 uVar10;
  float *pfVar11;
  bool bVar12;
  int iVar13;
  deUint32 dVar14;
  int iVar15;
  int iVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ObjectTraits *pOVar17;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined8 *puVar18;
  long *plVar19;
  MessageBuilder *pMVar20;
  TestError *pTVar21;
  long lVar22;
  long lVar23;
  size_type *psVar24;
  ulong *puVar25;
  TestLog *pTVar26;
  long lVar27;
  MessageBuilder *pMVar28;
  float *__result;
  float *pfVar29;
  string *psVar30;
  pointer pOVar31;
  _Rb_tree_const_iterator<tcu::Vector<float,_3>_> __last1;
  MessageBuilder *pMVar32;
  qpTestLog *pqVar33;
  TestLog TVar34;
  set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
  *this_00;
  string *outerLevels;
  int i;
  string *psVar35;
  uint uVar36;
  ulong uVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  Vector<bool,_3> result_2;
  Vec3Set nonMirroredEdgeVertices;
  Vector<bool,_3> result;
  Vec3 endpointB;
  Vec3Set mirroredEdgeVertices;
  vector<float,_std::allocator<float>_> patchTessLevels_1;
  VertexArrayBinding bindings [1];
  vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
  edgeDescriptions;
  Result tfResult;
  RandomViewport viewport;
  TFHandler tfHandler;
  vector<float,_std::allocator<float>_> patchTessLevels;
  Random rnd;
  string local_578;
  undefined1 local_558 [32];
  pointer local_538;
  undefined1 local_530 [8];
  undefined1 local_528 [24];
  _Base_ptr local_510;
  size_t local_508;
  undefined1 local_500 [8];
  ulong local_4f8;
  TestLog local_4f0 [2];
  Vector<float,_3> local_4e0;
  undefined4 uStack_4d4;
  TestLog local_4d0 [2];
  TestLog *local_4c0;
  set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
  local_4b8;
  vector<float,_std::allocator<float>_> local_488;
  deUint32 local_46c;
  undefined1 local_468 [8];
  _Alloc_hider local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450;
  int local_440;
  VertexArrayPointer local_438;
  long local_410;
  vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
  local_408;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_3f0;
  float local_3d8;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_3d0;
  RandomViewport local_3b8;
  RenderContext *local_3a8;
  ObjectWrapper local_3a0;
  ObjectWrapper local_388;
  ObjectWrapper local_370;
  long local_358;
  long local_350;
  SymmetricOuterEdgeCase *local_348;
  long local_340;
  long local_338;
  undefined1 local_330 [8];
  undefined1 local_328 [8];
  pointer local_320;
  _func_int *local_318 [2];
  int local_308;
  ios_base local_2c0 [8];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  local_4c0 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar13 = (*pRVar5->_vptr_RenderContext[4])(pRVar5);
  dVar14 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                       );
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_3b8,(RenderTarget *)CONCAT44(extraout_var,iVar13),0x10,0x10,dVar14);
  iVar13 = (*pRVar5->_vptr_RenderContext[3])(pRVar5);
  lVar23 = CONCAT44(extraout_var_00,iVar13);
  outerEdgeDescriptions(&local_408,this->m_primitiveType);
  fVar38 = 1.0;
  lVar22 = 4;
  pfVar29 = iterate::singleOuterEdgeLevels;
  do {
    fVar39 = *(float *)((long)iterate::singleOuterEdgeLevels + lVar22);
    pfVar11 = (float *)((long)iterate::singleOuterEdgeLevels + lVar22);
    if (*(float *)((long)iterate::singleOuterEdgeLevels + lVar22) <= fVar38) {
      fVar39 = fVar38;
      pfVar11 = pfVar29;
    }
    pfVar29 = pfVar11;
    fVar38 = fVar39;
    lVar22 = lVar22 + 4;
  } while (lVar22 != 0x30);
  local_538 = (pointer)CONCAT44(local_538._4_4_,*pfVar29);
  deRandom_init((deRandom *)local_1b0,0x7b);
  generateRandomPatchTessLevels
            ((vector<float,_std::allocator<float>_> *)local_330,1,0,local_538._0_4_,
             (Random *)local_1b0);
  TVar4 = this->m_primitiveType;
  bVar3 = this->m_usePointMode;
  iVar15 = referencePrimitiveCount
                     (TVar4,this->m_spacing,bVar3,(float *)local_330,(float *)((long)local_330 + 8))
  ;
  iVar13 = 1;
  if ((bVar3 == false) && (iVar13 = -1, TVar4 < TESSPRIMITIVETYPE_LAST)) {
    iVar13 = *(int *)(&DAT_01c39e30 + (ulong)TVar4 * 4);
  }
  if (local_330 != (undefined1  [8])0x0) {
    operator_delete((void *)local_330,(long)local_320 - (long)local_330);
  }
  pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_3a8 = pRVar5;
  iVar16 = (*pRVar5->_vptr_RenderContext[3])(pRVar5);
  pOVar17 = glu::objectTraits(OBJECTTYPE_TRANSFORM_FEEDBACK);
  glu::ObjectWrapper::ObjectWrapper
            (&local_3a0,(Functions *)CONCAT44(extraout_var_01,iVar16),pOVar17);
  iVar16 = (*pRVar5->_vptr_RenderContext[3])(pRVar5);
  pOVar17 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&local_388,(Functions *)CONCAT44(extraout_var_02,iVar16),pOVar17);
  iVar16 = (*pRVar5->_vptr_RenderContext[3])(pRVar5);
  pOVar17 = glu::objectTraits(OBJECTTYPE_QUERY);
  glu::ObjectWrapper::ObjectWrapper
            (&local_370,(Functions *)CONCAT44(extraout_var_03,iVar16),pOVar17);
  iVar16 = (*local_3a8->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_04,iVar16) + 0x40))(0x8c8e,local_388.m_object);
  (**(code **)(CONCAT44(extraout_var_04,iVar16) + 0x150))
            (0x8c8e,(long)(iVar15 * iVar13 * 0x10 + 0x30),0,0x88e9);
  (**(code **)(lVar23 + 0x1a00))(local_3b8.x,local_3b8.y,local_3b8.width,local_3b8.height);
  (**(code **)(lVar23 + 0xfd8))(0x8e72);
  pOVar31 = local_408.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_340 = lVar23;
  if (0 < (int)((ulong)((long)local_408.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_408.
                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
    lVar23 = 8;
    lVar22 = 0;
    local_348 = this;
    do {
      local_538 = local_408.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar22;
      local_410 = (long)(local_408.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                         ._M_impl.super__Vector_impl_data._M_start)->constantCoordinateValueChoices
                  + lVar23 + -4;
      lVar27 = 0;
      local_358 = lVar23;
      local_350 = lVar22;
      do {
        lVar23 = local_350;
        fVar38 = iterate::singleOuterEdgeLevels[lVar27];
        local_338 = lVar27;
        deRandom_init((deRandom *)local_330,0x7b);
        generateRandomPatchTessLevels(&local_488,1,(int)lVar23,fVar38,(Random *)local_330);
        local_1b0 = (undefined1  [8])(local_1a8 + 8);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"in_v_attr","");
        pfVar8 = local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pfVar7 = local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_330._0_4_ = 1;
        local_328 = (undefined1  [8])local_318;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_328,local_1b0,(char *)((long)local_1a8 + (long)local_1b0));
        local_308 = 0;
        local_468._0_4_ = local_330._0_4_;
        local_460._M_p = (pointer)&local_450;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_460,local_328,(long)local_320 + (long)local_328);
        local_440 = local_308;
        local_438.componentType = VTX_COMP_FLOAT;
        local_438.convert = VTX_COMP_CONVERT_NONE;
        local_438.numComponents = 1;
        local_438.numElements = (int)((ulong)((long)pfVar8 - (long)pfVar7) >> 2);
        local_438.stride = 0;
        local_438.data = pfVar7;
        if (local_328 != (undefined1  [8])local_318) {
          operator_delete((void *)local_328,(ulong)(local_318[0] + 1));
        }
        if (local_1b0 != (undefined1  [8])(local_1a8 + 8)) {
          operator_delete((void *)local_1b0,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
        }
        local_330 = (undefined1  [8])local_4c0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_328,"Testing with outer tessellation level ",0x26);
        std::ostream::_M_insert<double>((double)fVar38);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328," for the ",9);
        Functional::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                  ((string *)local_1b0,local_538);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_328,(char *)local_1b0,(long)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_328," edge, and with various levels for other edges",0x2e);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if (local_1b0 != (undefined1  [8])(local_1a8 + 8)) {
          operator_delete((void *)local_1b0,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
        std::ios_base::~ios_base(local_2b8);
        dVar14 = (((this->m_program).m_ptr)->m_program).m_program;
        (**(code **)(local_340 + 0x1680))(dVar14);
        uVar36 = 0;
        if (this->m_usePointMode == false) {
          uVar36 = 0xffffffff;
          if ((ulong)this->m_primitiveType < 3) {
            uVar36 = *(uint *)(&DAT_01c39e3c + (ulong)this->m_primitiveType * 4);
          }
        }
        uVar37 = (long)local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
        iVar13 = (*local_3a8->_vptr_RenderContext[3])();
        lVar23 = CONCAT44(extraout_var_05,iVar13);
        (**(code **)(lVar23 + 0xd0))(0x8e22,local_3a0.m_object);
        (**(code **)(lVar23 + 0x40))(0x8c8e,local_388.m_object);
        (**(code **)(lVar23 + 0x48))(0x8c8e,0,local_388.m_object);
        (**(code **)(lVar23 + 0x20))(0x8c88,local_370.m_object);
        (**(code **)(lVar23 + 0x30))(uVar36);
        local_330._4_4_ = (undefined4)(uVar37 >> 2);
        local_330._0_4_ = 9.80909e-45;
        local_328._0_4_ = 3;
        local_320 = (pointer)0x0;
        glu::draw(local_3a8,dVar14,1,(VertexArrayBinding *)local_468,(PrimitiveList *)local_330,
                  (DrawUtilCallback *)0x0);
        dVar14 = (**(code **)(lVar23 + 0x800))();
        glu::checkError(dVar14,"Draw failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                        ,0x15e);
        (**(code **)(lVar23 + 0x638))();
        (**(code **)(lVar23 + 0x628))(0x8c88);
        local_330._0_4_ = 0xffffffff;
        (**(code **)(lVar23 + 0xa20))(local_370.m_object,0x8866,local_330);
        uVar10 = local_330._0_4_;
        if ((float)local_330._0_4_ == -NAN) {
          pTVar21 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar21,(char *)0x0,"result != (deUint32)-1",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                     ,0x104);
          __cxa_throw(pTVar21,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        iVar13 = -1;
        if (uVar36 < 5) {
          iVar13 = *(int *)(&DAT_01c39e48 + (ulong)uVar36 * 4);
        }
        uVar36 = iVar13 * local_330._0_4_;
        std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                  (&local_3f0,(long)(int)uVar36,(allocator_type *)local_330);
        pVVar9 = local_3f0.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar22 = (**(code **)(lVar23 + 0xd00))(0x8c8e,0,(long)(int)(uVar36 * 0x10),1);
        local_46c = (**(code **)(lVar23 + 0x800))();
        local_500 = (undefined1  [8])local_4f0;
        local_4f8 = 0;
        local_4f0[0].m_log._0_1_ = 0;
        puVar18 = (undefined8 *)std::__cxx11::string::append(local_500);
        local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
        psVar24 = puVar18 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar18 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar24) {
          local_578.field_2._M_allocated_capacity = *psVar24;
          local_578.field_2._8_8_ = puVar18[3];
        }
        else {
          local_578.field_2._M_allocated_capacity = *psVar24;
          local_578._M_dataplus._M_p = (pointer)*puVar18;
        }
        local_578._M_string_length = puVar18[1];
        *puVar18 = psVar24;
        puVar18[1] = 0;
        *(undefined1 *)(puVar18 + 2) = 0;
        glu::getBufferTargetName(0x8c8e);
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_578);
        local_558._0_8_ = local_558 + 0x10;
        psVar24 = (size_type *)(plVar19 + 2);
        if ((size_type *)*plVar19 == psVar24) {
          local_558._16_8_ = *psVar24;
          local_558._24_8_ = plVar19[3];
        }
        else {
          local_558._16_8_ = *psVar24;
          local_558._0_8_ = (size_type *)*plVar19;
        }
        local_558._8_8_ = plVar19[1];
        *plVar19 = (long)psVar24;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        plVar19 = (long *)std::__cxx11::string::append(local_558);
        local_4b8._M_t._M_impl._0_8_ =
             &local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        puVar25 = (ulong *)(plVar19 + 2);
        if ((_Base_ptr *)*plVar19 == (_Base_ptr *)puVar25) {
          local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*puVar25;
          local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar19[3];
        }
        else {
          local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*puVar25;
          local_4b8._M_t._M_impl._0_8_ = (_Base_ptr *)*plVar19;
        }
        local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar19[1];
        *plVar19 = (long)puVar25;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
        std::ostream::operator<<((ostringstream *)local_330,uVar36 * 0x10);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
        std::ios_base::~ios_base(local_2c0);
        pqVar33 = (qpTestLog *)0xf;
        if ((_Base_ptr *)local_4b8._M_t._M_impl._0_8_ !=
            &local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          pqVar33 = (qpTestLog *)local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        }
        pqVar2 = (qpTestLog *)
                 (CONCAT44(uStack_4d4,local_4e0.m_data[2]) +
                 local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
        if (pqVar33 < pqVar2) {
          TVar34.m_log = (qpTestLog *)0xf;
          if ((TestLog *)local_4e0.m_data._0_8_ != local_4d0) {
            TVar34.m_log = local_4d0[0].m_log;
          }
          if (TVar34.m_log < pqVar2) goto LAB_0141b68e;
          puVar18 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_4e0,0,(char *)0x0,local_4b8._M_t._M_impl._0_8_);
        }
        else {
LAB_0141b68e:
          puVar18 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_4b8,local_4e0.m_data._0_8_);
        }
        local_530 = (undefined1  [8])(local_528 + 8);
        pcVar1 = (char *)(puVar18 + 2);
        if ((char *)*puVar18 == pcVar1) {
          local_528._8_8_ = *(undefined8 *)pcVar1;
          local_528._16_8_ = puVar18[3];
        }
        else {
          local_528._8_8_ = *(undefined8 *)pcVar1;
          local_530 = (undefined1  [8])*puVar18;
        }
        local_528._0_8_ = puVar18[1];
        *puVar18 = pcVar1;
        puVar18[1] = 0;
        *pcVar1 = '\0';
        plVar19 = (long *)std::__cxx11::string::append(local_530);
        local_1b0 = (undefined1  [8])(local_1a8 + 8);
        pTVar26 = (TestLog *)(plVar19 + 2);
        if ((TestLog *)*plVar19 == pTVar26) {
          local_1a0[0]._0_8_ = pTVar26->m_log;
          local_1a0[0]._8_8_ = plVar19[3];
        }
        else {
          local_1a0[0]._0_8_ = pTVar26->m_log;
          local_1b0 = (undefined1  [8])*plVar19;
        }
        local_1a8 = (undefined1  [8])plVar19[1];
        *plVar19 = (long)pTVar26;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        glu::checkError(local_46c,(char *)local_1b0,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                        ,0x10d);
        if (local_1b0 != (undefined1  [8])(local_1a8 + 8)) {
          operator_delete((void *)local_1b0,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
        }
        if (local_530 != (undefined1  [8])(local_528 + 8)) {
          operator_delete((void *)local_530,(ulong)(local_528._8_8_ + 1));
        }
        if ((TestLog *)local_4e0.m_data._0_8_ != local_4d0) {
          operator_delete((void *)local_4e0.m_data._0_8_,
                          (ulong)&((_Rb_tree_impl<deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_false>
                                    *)&(local_4d0[0].m_log)->flags)->field_0x1);
        }
        if ((_Base_ptr *)local_4b8._M_t._M_impl._0_8_ !=
            &local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)local_4b8._M_t._M_impl._0_8_,
                          (ulong)&((_Rb_tree_impl<deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_false>
                                    *)&(local_4b8._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color)->field_0x1);
        }
        if ((undefined1 *)local_558._0_8_ != local_558 + 0x10) {
          operator_delete((void *)local_558._0_8_,local_558._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578._M_dataplus._M_p != &local_578.field_2) {
          operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
        }
        if (local_500 != (undefined1  [8])local_4f0) {
          operator_delete((void *)local_500,
                          CONCAT71(local_4f0[0].m_log._1_7_,local_4f0[0].m_log._0_1_) + 1);
        }
        if (lVar22 == 0) {
          pTVar21 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar21,(char *)0x0,"mappedData != DE_NULL",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                     ,0x10e);
          __cxa_throw(pTVar21,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        if (0 < (int)uVar36) {
          lVar27 = 0;
          do {
            uVar6 = ((undefined8 *)(lVar22 + lVar27))[1];
            puVar18 = (undefined8 *)((long)pVVar9->m_data + lVar27);
            *puVar18 = *(undefined8 *)(lVar22 + lVar27);
            puVar18[1] = uVar6;
            lVar27 = lVar27 + 0x10;
          } while ((ulong)uVar36 << 4 != lVar27);
        }
        (**(code **)(lVar23 + 0x1670))(0x8c8e);
        local_3d8 = (float)uVar10;
        std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                  (&local_3d0,&local_3f0);
        this = local_348;
        if (local_3f0.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_3f0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_3f0.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_3f0.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        TVar4 = this->m_primitiveType;
        bVar3 = this->m_usePointMode;
        outerLevels = (string *)
                      ((long)local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start + 8);
        iVar15 = referencePrimitiveCount
                           (TVar4,this->m_spacing,bVar3,
                            local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,(float *)outerLevels);
        iVar16 = (int)outerLevels;
        iVar13 = 1;
        if ((bVar3 == false) && (iVar13 = -1, TVar4 < TESSPRIMITIVETYPE_LAST)) {
          iVar13 = *(int *)(&DAT_01c39e30 + (ulong)TVar4 * 4);
        }
        uVar36 = iVar13 * iVar15;
        if (uVar36 == (uint)((ulong)((long)local_3d0.
                                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_3d0.
                                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
          iVar13 = 0;
          local_530 = (undefined1  [8])((ulong)local_530 & 0xffffffffffffff00);
          local_528._0_8_ = local_528._0_8_ & 0xffffffff00000000;
          local_528._8_8_ = (MessageBuilder *)0x0;
          local_528._16_8_ = (_Base_ptr)local_528;
          local_510 = (_Base_ptr)local_528;
          local_508 = 0;
          local_4b8._M_t._M_impl._0_8_ = local_4b8._M_t._M_impl._0_8_ & 0xffffffffffffff00;
          local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
          local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_4b8._M_t._M_impl.super__Rb_tree_header._M_header;
          local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_4b8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          if (0 < (int)uVar36) {
            uVar37 = 0;
            lVar23 = local_410;
            do {
              pVVar9 = local_3d0.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              iVar13 = (int)uVar37 * 0x10;
              fVar38 = local_3d0.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar37].m_data[2];
              local_330 = *(undefined1 (*) [8])
                           local_3d0.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar37].m_data;
              local_328._0_4_ = fVar38;
              psVar30 = (string *)(long)local_538->numConstantCoordinateValueChoices;
              if (0 < (long)psVar30) {
                lVar22 = (long)local_538->constantCoordinateIndex;
                fVar39 = *(float *)(local_330 + lVar22 * 4);
                fVar41 = local_538->constantCoordinateValueChoices[0];
                if ((fVar39 != fVar41) || (NAN(fVar39) || NAN(fVar41))) {
                  outerLevels = (string *)&DAT_00000001;
                  do {
                    psVar35 = outerLevels;
                    outerLevels = psVar35;
                    if (psVar30 == psVar35) break;
                    outerLevels = (string *)((long)&(psVar35->_M_dataplus)._M_p + 1);
                    pfVar29 = (float *)(lVar23 + -4 + (long)psVar35 * 4);
                  } while ((fVar39 != *pfVar29) || (NAN(fVar39) || NAN(*pfVar29)));
                  if (psVar30 <= psVar35) goto LAB_0141bbf9;
                }
                TVar4 = this->m_primitiveType;
                fVar39 = SUB84(local_330,0);
                fVar40 = (float)((ulong)local_330 >> 0x20);
                if (TVar4 == TESSPRIMITIVETYPE_TRIANGLES) {
                  local_558._8_8_ = local_558._8_8_ & 0xffffffff00000000;
                  local_558._0_8_ = (char *)0x0;
                  local_578._M_dataplus._M_p = &DAT_3f0000003f000000;
                  local_578._M_string_length = CONCAT44(local_578._M_string_length._4_4_,0x3f000000)
                  ;
                  local_500 = (undefined1  [8])((ulong)local_500 & 0xffffffffff000000);
                  local_500[lVar22] = 1;
                  local_1a8 = (undefined1  [8])((ulong)local_1a8 & 0xffffffff00000000);
                  local_1b0 = (undefined1  [8])0x0;
                  psVar30 = (string *)local_558;
                  outerLevels = &local_578;
                  lVar27 = 0;
                  do {
                    psVar35 = psVar30;
                    if (local_500[lVar27] == '\0') {
                      psVar35 = outerLevels;
                    }
                    *(float *)(local_1b0 + lVar27 * 4) = *(float *)&(psVar35->_M_dataplus)._M_p;
                    lVar27 = lVar27 + 1;
                    outerLevels = (string *)((long)&(outerLevels->_M_dataplus)._M_p + 4);
                    psVar30 = (string *)((long)&(psVar30->_M_dataplus)._M_p + 4);
                  } while (lVar27 != 3);
                  if ((fVar39 == (float)local_1b0._0_4_) &&
                     (!NAN(fVar39) && !NAN((float)local_1b0._0_4_))) {
                    if ((fVar40 == (float)local_1b0._4_4_) &&
                       (!NAN(fVar40) && !NAN((float)local_1b0._4_4_))) {
                      if ((fVar38 == (float)local_1a8._0_4_) &&
                         (!NAN(fVar38) && !NAN((float)local_1a8._0_4_))) goto LAB_0141bbf9;
                    }
                  }
                }
                if (TVar4 == TESSPRIMITIVETYPE_QUADS) {
                  local_1b0 = (undefined1  [8])((ulong)local_1b0 & 0xffffffffffff0000);
                  local_1b0[lVar22] = 1;
                  fVar42 = fVar41;
                  if (local_1b0[1] == '\0') {
                    fVar42 = 0.5;
                  }
                  if (local_1b0[0] == '\0') {
                    fVar41 = 0.5;
                  }
                  if (fVar40 == fVar42 && fVar41 == fVar39) goto LAB_0141bbf9;
                }
                if ((TVar4 != TESSPRIMITIVETYPE_ISOLINES) ||
                   (((((((fVar39 != 0.0 || (NAN(fVar39))) || (fVar40 != 0.5)) ||
                       ((NAN(fVar40) || (fVar38 != 0.0)))) || (NAN(fVar38))) &&
                     (((fVar39 != 1.0 || (NAN(fVar39))) ||
                      ((fVar40 != 0.5 || (((NAN(fVar40) || (fVar38 != 0.0)) || (NAN(fVar38)))))))))
                    && ((((fVar39 != 0.0 || (NAN(fVar39))) ||
                         ((fVar40 != 0.0 || (((NAN(fVar40) || (fVar38 != 0.0)) || (NAN(fVar38)))))))
                        && (((((fVar39 != 1.0 || (NAN(fVar39))) || (fVar40 != 0.0)) ||
                             ((NAN(fVar40) || (fVar38 != 0.0)))) || (NAN(fVar38))))))))) {
                  this_00 = (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_530;
                  if (0.5 < pVVar9[uVar37].m_data[3]) {
                    this_00 = &local_4b8;
                  }
                  std::
                  set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ::insert(this_00,(value_type *)local_330);
                  lVar23 = local_410;
                }
              }
LAB_0141bbf9:
              iVar16 = (int)outerLevels;
              uVar37 = uVar37 + 1;
            } while (uVar37 != uVar36);
          }
          TVar4 = this->m_primitiveType;
          if (TVar4 == TESSPRIMITIVETYPE_ISOLINES) {
LAB_0141bddd:
            if (local_508 != local_4b8._M_t._M_impl.super__Rb_tree_header._M_node_count) {
LAB_0141be10:
              local_1b0 = (undefined1  [8])local_4c0;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "Failure: the set of mirrored edges isn\'t equal to the set of non-mirrored edges (ignoring endpoints and possible middle)"
                         ,0x78);
              local_330 = (undefined1  [8])
                          tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)local_1b0,
                                     (EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_328,"Note: non-mirrored vertices:\n",0x1d);
              containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                        ((string *)local_558,(Functional *)local_530,
                         (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          *)0x0,iVar13,iVar16);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_328,(char *)local_558._0_8_,local_558._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_328,"\nmirrored vertices:\n",0x14);
              containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                        (&local_578,(Functional *)&local_4b8,
                         (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          *)0x0,iVar13,iVar16);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_328,local_578._M_dataplus._M_p,local_578._M_string_length)
              ;
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_578._M_dataplus._M_p != &local_578.field_2) {
                operator_delete(local_578._M_dataplus._M_p,
                                local_578.field_2._M_allocated_capacity + 1);
              }
              if ((undefined1 *)local_558._0_8_ != local_558 + 0x10) {
                operator_delete((void *)local_558._0_8_,local_558._16_8_ + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
              std::ios_base::~ios_base(local_2b8);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
              __last1._M_node = (_Base_ptr)&DAT_00000001;
              tcu::TestContext::setTestResult
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                         QP_TEST_RESULT_FAIL,"Invalid set of vertices");
              goto LAB_0141c4e6;
            }
            __last1._M_node = (_Base_ptr)local_528;
            bVar12 = std::__equal<false>::
                     equal<std::_Rb_tree_const_iterator<tcu::Vector<float,3>>,std::_Rb_tree_const_iterator<tcu::Vector<float,3>>>
                               ((_Rb_tree_const_iterator<tcu::Vector<float,_3>_>)local_528._16_8_,
                                __last1,(_Rb_tree_const_iterator<tcu::Vector<float,_3>_>)
                                        local_4b8._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_left);
            bVar3 = true;
            if (!bVar12) goto LAB_0141be10;
          }
          else {
            pMVar28 = (MessageBuilder *)0x0;
            local_4f8 = local_4f8 & 0xffffffff00000000;
            local_500 = (undefined1  [8])0x0;
            local_4e0.m_data[2] = 0.0;
            local_4e0.m_data._0_8_ = (TestLog *)0x0;
            if (TVar4 == TESSPRIMITIVETYPE_QUADS) {
              local_500._4_4_ = local_538->constantCoordinateValueChoices[0];
              iVar13 = local_538->constantCoordinateIndex;
              local_330 = (undefined1  [8])((ulong)local_330 & 0xffffffffffff0000);
              local_330[iVar13] = 1;
              local_500._0_4_ = local_500._4_4_;
              if (local_330[0] == (allocator_type)0x0) {
                local_500._0_4_ = 0.0;
              }
              if (local_330[1] == PRIMITIVETYPE_TRIANGLES >> 8) {
                local_500._4_4_ = 0.0;
              }
              local_4e0.m_data[1] = local_538->constantCoordinateValueChoices[0];
              local_330 = (undefined1  [8])((ulong)local_330 & 0xffffffffffff0000);
              pMVar28 = (MessageBuilder *)CONCAT71((int7)((ulong)local_538 >> 8),1);
              local_330[iVar13] = 1;
              local_4e0.m_data[0] = local_4e0.m_data[1];
              if (local_330[0] == (allocator_type)0x0) {
                local_4e0.m_data[0] = 1.0;
              }
              if (local_330[1] == PRIMITIVETYPE_TRIANGLES >> 8) {
                local_4e0.m_data[1] = 1.0;
              }
            }
            else if (TVar4 == TESSPRIMITIVETYPE_TRIANGLES) {
              local_1b0 = (undefined1  [8])0x3f8000003f800000;
              local_1a8._0_4_ = 0x3f800000;
              local_558._8_8_ = local_558._8_8_ & 0xffffffff00000000;
              local_558._0_8_ = (pointer)0x0;
              local_578._M_dataplus._M_p = local_578._M_dataplus._M_p & 0xffffffffff000000;
              *(undefined1 *)
               ((long)&local_578._M_dataplus._M_p +
               (long)(local_538->constantCoordinateIndex +
                      ((local_538->constantCoordinateIndex + 1) / 3) * -3 + 1)) = 1;
              local_330 = (undefined1  [8])0x0;
              local_328 = (undefined1  [8])((ulong)local_328 & 0xffffffff00000000);
              pMVar28 = (MessageBuilder *)local_558;
              lVar23 = 0;
              pMVar20 = (MessageBuilder *)local_1b0;
              do {
                pMVar32 = pMVar20;
                if (*(char *)((long)&local_578._M_dataplus._M_p + lVar23) == '\0') {
                  pMVar32 = pMVar28;
                }
                *(undefined4 *)(local_330 + lVar23 * 4) = *(undefined4 *)&pMVar32->m_log;
                lVar23 = lVar23 + 1;
                pMVar28 = (MessageBuilder *)((long)&pMVar28->m_log + 4);
                pMVar20 = (MessageBuilder *)((long)&pMVar20->m_log + 4);
              } while (lVar23 != 3);
              local_4f8 = CONCAT44(local_4f8._4_4_,local_328._0_4_);
              local_500 = local_330;
              local_1b0 = (undefined1  [8])0x3f8000003f800000;
              local_1a8._0_4_ = 0x3f800000;
              local_558._8_8_ = local_558._8_8_ & 0xffffffff00000000;
              local_558._0_8_ = (char *)0x0;
              local_578._M_dataplus._M_p = local_578._M_dataplus._M_p & 0xffffffffff000000;
              *(undefined1 *)
               ((long)&local_578._M_dataplus._M_p +
               (long)(local_538->constantCoordinateIndex +
                      ((local_538->constantCoordinateIndex + 2) / 3) * -3 + 2)) = 1;
              local_330 = (undefined1  [8])0x0;
              local_328 = (undefined1  [8])((ulong)local_328 & 0xffffffff00000000);
              pMVar28 = (MessageBuilder *)local_558;
              lVar23 = 0;
              pMVar20 = (MessageBuilder *)local_1b0;
              do {
                pMVar32 = pMVar20;
                if (*(char *)((long)&local_578._M_dataplus._M_p + lVar23) == '\0') {
                  pMVar32 = pMVar28;
                }
                *(undefined4 *)(local_330 + lVar23 * 4) = *(undefined4 *)&pMVar32->m_log;
                lVar23 = lVar23 + 1;
                pMVar28 = (MessageBuilder *)((long)&pMVar28->m_log + 4);
                pMVar20 = (MessageBuilder *)((long)&pMVar20->m_log + 4);
              } while (lVar23 != 3);
              local_4e0.m_data[2] = (float)local_328._0_4_;
              local_4e0.m_data[0] = (float)local_330._0_4_;
              local_4e0.m_data[1] = (float)local_330._4_4_;
            }
            if ((MessageBuilder *)local_528._8_8_ != (MessageBuilder *)0x0) {
              pMVar28 = (MessageBuilder *)local_528;
              pMVar20 = (MessageBuilder *)local_528._8_8_;
              do {
                fVar38 = *(float *)&(pMVar20->m_str).
                                    super_basic_ostream<char,_std::char_traits<char>_>.field_0x18;
                lVar23 = 0x18;
                if ((float)local_500._0_4_ <= fVar38) {
                  lVar22 = 0;
                  fVar39 = (float)local_500._0_4_;
                  do {
                    if ((fVar39 < fVar38) || (lVar22 == 2)) {
                      lVar23 = 0x10;
                      pMVar28 = pMVar20;
                      break;
                    }
                    fVar38 = *(float *)(&(pMVar20->m_str).
                                         super_basic_ostream<char,_std::char_traits<char>_>.
                                         field_0x1c + lVar22 * 4);
                    fVar39 = *(float *)(local_500 + lVar22 * 4 + 4);
                    lVar22 = lVar22 + 1;
                  } while (fVar39 <= fVar38);
                }
                pMVar20 = *(MessageBuilder **)((long)&pMVar20->m_log + lVar23);
              } while (pMVar20 != (MessageBuilder *)0x0);
              if ((pMVar28 != (MessageBuilder *)local_528) &&
                 (fVar38 = *(float *)&(pMVar28->m_str).
                                      super_basic_ostream<char,_std::char_traits<char>_>.field_0x18,
                 fVar38 <= (float)local_500._0_4_)) {
                lVar23 = 0;
                fVar39 = (float)local_500._0_4_;
LAB_0141c265:
                if ((fVar39 <= fVar38) && (lVar23 != 2)) goto code_r0x0141c270;
                pMVar28 = (MessageBuilder *)local_528;
                pMVar20 = (MessageBuilder *)local_528._8_8_;
                do {
                  fVar38 = *(float *)&(pMVar20->m_str).
                                      super_basic_ostream<char,_std::char_traits<char>_>.field_0x18;
                  lVar23 = 0x18;
                  if (local_4e0.m_data[0] <= fVar38) {
                    lVar22 = 0;
                    fVar39 = local_4e0.m_data[0];
                    do {
                      if ((fVar39 < fVar38) || (lVar22 == 2)) {
                        lVar23 = 0x10;
                        pMVar28 = pMVar20;
                        break;
                      }
                      fVar38 = *(float *)(&(pMVar20->m_str).
                                           super_basic_ostream<char,_std::char_traits<char>_>.
                                           field_0x1c + lVar22 * 4);
                      fVar39 = local_4e0.m_data[lVar22 + 1];
                      lVar22 = lVar22 + 1;
                    } while (fVar39 <= fVar38);
                  }
                  pMVar20 = *(MessageBuilder **)((long)&pMVar20->m_log + lVar23);
                } while (pMVar20 != (MessageBuilder *)0x0);
                if ((pMVar28 == (MessageBuilder *)local_528) ||
                   (fVar38 = *(float *)&(pMVar28->m_str).
                                        super_basic_ostream<char,_std::char_traits<char>_>.
                                        field_0x18, local_4e0.m_data[0] < fVar38))
                goto LAB_0141c323;
                lVar23 = 0;
                fVar39 = local_4e0.m_data[0];
                while ((fVar39 <= fVar38 && (lVar23 != 2))) {
                  fVar39 = local_4e0.m_data[lVar23 + 1];
                  fVar38 = *(float *)(&(pMVar28->m_str).
                                       super_basic_ostream<char,_std::char_traits<char>_>.field_0x1c
                                     + lVar23 * 4);
                  lVar23 = lVar23 + 1;
                  if (fVar39 < fVar38) goto LAB_0141c323;
                }
                std::
                set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                ::erase((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                         *)local_530,(key_type *)local_500);
                iVar13 = (int)pMVar28;
                std::
                set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                ::erase((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                         *)local_530,&local_4e0);
                goto LAB_0141bddd;
              }
            }
LAB_0141c323:
            iVar13 = (int)pMVar28;
            local_1b0 = (undefined1  [8])local_4c0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Failure: edge doesn\'t contain both endpoints, ",0x2e);
            tcu::operator<<((ostream *)local_1a8,(Vector<float,_3> *)local_500);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," and ",5);
            tcu::operator<<((ostream *)local_1a8,&local_4e0);
            local_330 = (undefined1  [8])
                        tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_1b0,
                                   (EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_328,"Note: non-mirrored vertices:\n",0x1d);
            containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                      ((string *)local_558,(Functional *)local_530,
                       (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        *)0x0,iVar13,iVar16);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_328,(char *)local_558._0_8_,local_558._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_328,"\nmirrored vertices:\n",0x14);
            containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                      (&local_578,(Functional *)&local_4b8,
                       (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        *)0x0,iVar13,iVar16);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_328,local_578._M_dataplus._M_p,local_578._M_string_length);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_578._M_dataplus._M_p != &local_578.field_2) {
              operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1
                             );
            }
            if ((undefined1 *)local_558._0_8_ != local_558 + 0x10) {
              operator_delete((void *)local_558._0_8_,local_558._16_8_ + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
            std::ios_base::~ios_base(local_2b8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            __last1._M_node = (_Base_ptr)&DAT_00000001;
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Invalid set of vertices");
LAB_0141c4e6:
            bVar3 = false;
          }
          std::
          _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
          ::_M_erase((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      *)local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                     (_Link_type)__last1._M_node);
          std::
          _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
          ::_M_erase((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      *)local_528._8_8_,(_Link_type)__last1._M_node);
        }
        else {
          local_1b0 = (undefined1  [8])local_4c0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "Failure: the number of vertices returned by transform feedback is ",0x42);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", expected ",0xb)
          ;
          std::ostream::operator<<(local_1a8,uVar36);
          local_330 = (undefined1  [8])
                      tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_1b0,
                                 (EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_328,
                     "Note: rendered 1 patch, tessellation levels are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
                     ,0x6d);
          containerStr<std::vector<float,std::allocator<float>>>
                    ((string *)local_530,
                     (Functional *)
                     local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (vector<float,_std::allocator<float>_> *)
                     local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,6,iVar16);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_328,(char *)local_530,local_528._0_8_);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if (local_530 != (undefined1  [8])(local_528 + 8)) {
            operator_delete((void *)local_530,(ulong)(local_528._8_8_ + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
          std::ios_base::~ios_base(local_2b8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Invalid set of vertices");
          bVar3 = false;
        }
        if (local_3d0.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_3d0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_3d0.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_3d0.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460._M_p != &local_450) {
          operator_delete(local_460._M_p,local_450._M_allocated_capacity + 1);
        }
        if ((Functional *)
            local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (Functional *)0x0) {
          operator_delete(local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (!bVar3) {
          glu::ObjectWrapper::~ObjectWrapper(&local_370);
          glu::ObjectWrapper::~ObjectWrapper(&local_388);
          glu::ObjectWrapper::~ObjectWrapper(&local_3a0);
          goto LAB_0141c650;
        }
        lVar27 = local_338 + 1;
      } while (lVar27 != 0xc);
      lVar22 = local_350 + 1;
      lVar23 = local_358 + 0x10;
      pOVar31 = local_408.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar22 < (int)((ulong)((long)local_408.
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_408.
                                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4));
  }
  glu::ObjectWrapper::~ObjectWrapper(&local_370);
  glu::ObjectWrapper::~ObjectWrapper(&local_388);
  glu::ObjectWrapper::~ObjectWrapper(&local_3a0);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  local_408.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
  ._M_impl.super__Vector_impl_data._M_start = pOVar31;
LAB_0141c650:
  if (local_408.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return STOP;
code_r0x0141c270:
  fVar39 = *(float *)(local_500 + lVar23 * 4 + 4);
  fVar38 = *(float *)(&(pMVar28->m_str).super_basic_ostream<char,_std::char_traits<char>_>.
                       field_0x1c + lVar23 * 4);
  lVar23 = lVar23 + 1;
  if (fVar39 < fVar38) goto LAB_0141c323;
  goto LAB_0141c265;
}

Assistant:

SymmetricOuterEdgeCase::IterateResult SymmetricOuterEdgeCase::iterate (void)
{
	typedef TransformFeedbackHandler<Vec4> TFHandler;

	TestLog&							log							= m_testCtx.getLog();
	const RenderContext&				renderCtx					= m_context.getRenderContext();
	const RandomViewport				viewport					(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const glw::Functions&				gl							= renderCtx.getFunctions();

	static const float					singleOuterEdgeLevels[]		= { 1.0f, 1.2f, 1.9f, 2.3f, 2.8f, 3.3f, 3.8f, 10.2f, 1.6f, 24.4f, 24.7f, 63.0f };
	const vector<OuterEdgeDescription>	edgeDescriptions			= outerEdgeDescriptions(m_primitiveType);

	{
		// Compute the number vertices in the largest draw call, so we can allocate the TF buffer just once.
		int maxNumVerticesInDrawCall;
		{
			const vector<float> patchTessLevels = generatePatchTessLevels(1, 0 /* outer-edge index doesn't affect vertex count */, arrayMax(singleOuterEdgeLevels));
			maxNumVerticesInDrawCall = referenceVertexCount(m_primitiveType, m_spacing, m_usePointMode, &patchTessLevels[0], &patchTessLevels[2]);
		}

		{
			const TFHandler tfHandler(m_context.getRenderContext(), maxNumVerticesInDrawCall);

			setViewport(gl, viewport);
			gl.patchParameteri(GL_PATCH_VERTICES, 6);

			for (int outerEdgeIndex = 0; outerEdgeIndex < (int)edgeDescriptions.size(); outerEdgeIndex++)
			{
				const OuterEdgeDescription& edgeDesc = edgeDescriptions[outerEdgeIndex];

				for (int outerEdgeLevelCaseNdx = 0; outerEdgeLevelCaseNdx < DE_LENGTH_OF_ARRAY(singleOuterEdgeLevels); outerEdgeLevelCaseNdx++)
				{
					typedef std::set<Vec3, VecLexLessThan<3> > Vec3Set;

					const vector<float>				patchTessLevels		= generatePatchTessLevels(1, outerEdgeIndex, singleOuterEdgeLevels[outerEdgeLevelCaseNdx]);
					const glu::VertexArrayBinding	bindings[]			= { glu::va::Float("in_v_attr", 1, (int)patchTessLevels.size(), 0, &patchTessLevels[0]) };

					log << TestLog::Message << "Testing with outer tessellation level " << singleOuterEdgeLevels[outerEdgeLevelCaseNdx]
											<< " for the " << edgeDesc.description() << " edge, and with various levels for other edges" << TestLog::EndMessage;

					{
						const deUint32 programGL = m_program->getProgram();

						gl.useProgram(programGL);

						{
							const TFHandler::Result		tfResult		= tfHandler.renderAndGetPrimitives(programGL, outputPrimitiveTypeGL(m_primitiveType, m_usePointMode),
																										   DE_LENGTH_OF_ARRAY(bindings), &bindings[0], (int)patchTessLevels.size());
							const int					refNumVertices	= referenceVertexCount(m_primitiveType, m_spacing, m_usePointMode, &patchTessLevels[0], &patchTessLevels[2]);

							if ((int)tfResult.varying.size() != refNumVertices)
							{
								log << TestLog::Message << "Failure: the number of vertices returned by transform feedback is "
														<< tfResult.varying.size() << ", expected " << refNumVertices << TestLog::EndMessage
									<< TestLog::Message << "Note: rendered 1 patch, tessellation levels are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
														<< containerStr(patchTessLevels, 6) << TestLog::EndMessage;

								m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
								return STOP;
							}

							// Check the vertices.

							{
								Vec3Set nonMirroredEdgeVertices;
								Vec3Set mirroredEdgeVertices;

								// We're interested in just the vertices on the current outer edge.
								for(int vtxNdx = 0; vtxNdx < refNumVertices; vtxNdx++)
								{
									const Vec3& vtx = tfResult.varying[vtxNdx].swizzle(0,1,2);
									if (edgeDesc.contains(vtx))
									{
										// Ignore the middle vertex of the outer edge, as it's exactly at the mirroring point;
										// for isolines, also ignore (0, 0) and (1, 0) because there's no mirrored counterpart for them.
										if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES && vtx == tcu::select(Vec3(0.0f), Vec3(0.5f), singleTrueMask<3>(edgeDesc.constantCoordinateIndex)))
											continue;
										if (m_primitiveType == TESSPRIMITIVETYPE_QUADS && vtx.swizzle(0,1) == tcu::select(Vec2(edgeDesc.constantCoordinateValueChoices[0]),
																															   Vec2(0.5f),
																															   singleTrueMask<2>(edgeDesc.constantCoordinateIndex)))
											continue;
										if (m_primitiveType == TESSPRIMITIVETYPE_ISOLINES && (vtx == Vec3(0.0f, 0.5f, 0.0f) || vtx == Vec3(1.0f, 0.5f, 0.0f) ||
																							  vtx == Vec3(0.0f, 0.0f, 0.0f) || vtx == Vec3(1.0f, 0.0f, 0.0f)))
											continue;

										const bool isMirrored = tfResult.varying[vtxNdx].w() > 0.5f;
										if (isMirrored)
											mirroredEdgeVertices.insert(vtx);
										else
											nonMirroredEdgeVertices.insert(vtx);
									}
								}

								if (m_primitiveType != TESSPRIMITIVETYPE_ISOLINES)
								{
									// Check that both endpoints are present. Note that endpoints aren't mirrored by the shader, since they belong to more than one edge.

									Vec3 endpointA;
									Vec3 endpointB;

									if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
									{
										endpointA = tcu::select(Vec3(1.0f), Vec3(0.0f), singleTrueMask<3>((edgeDesc.constantCoordinateIndex + 1) % 3));
										endpointB = tcu::select(Vec3(1.0f), Vec3(0.0f), singleTrueMask<3>((edgeDesc.constantCoordinateIndex + 2) % 3));
									}
									else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS)
									{
										endpointA.xy() = tcu::select(Vec2(edgeDesc.constantCoordinateValueChoices[0]), Vec2(0.0f), singleTrueMask<2>(edgeDesc.constantCoordinateIndex));
										endpointB.xy() = tcu::select(Vec2(edgeDesc.constantCoordinateValueChoices[0]), Vec2(1.0f), singleTrueMask<2>(edgeDesc.constantCoordinateIndex));
									}
									else
										DE_ASSERT(false);

									if (!contains(nonMirroredEdgeVertices, endpointA) ||
										!contains(nonMirroredEdgeVertices, endpointB))
									{
										log << TestLog::Message << "Failure: edge doesn't contain both endpoints, " << endpointA << " and " << endpointB << TestLog::EndMessage
											<< TestLog::Message << "Note: non-mirrored vertices:\n" << containerStr(nonMirroredEdgeVertices, 5)
																<< "\nmirrored vertices:\n" << containerStr(mirroredEdgeVertices, 5) << TestLog::EndMessage;
										m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
										return STOP;
									}
									nonMirroredEdgeVertices.erase(endpointA);
									nonMirroredEdgeVertices.erase(endpointB);
								}

								if (nonMirroredEdgeVertices != mirroredEdgeVertices)
								{
									log << TestLog::Message << "Failure: the set of mirrored edges isn't equal to the set of non-mirrored edges (ignoring endpoints and possible middle)" << TestLog::EndMessage
										<< TestLog::Message << "Note: non-mirrored vertices:\n" << containerStr(nonMirroredEdgeVertices, 5)
																<< "\nmirrored vertices:\n" << containerStr(mirroredEdgeVertices, 5) << TestLog::EndMessage;
									m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
									return STOP;
								}
							}
						}
					}
				}
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}